

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status curi_parse_query(char *query,size_t len,curi_settings *settings,void *userData)

{
  char *pcVar1;
  undefined1 local_c0 [8];
  curi_settings defaultSettings;
  size_t sStack_30;
  curi_status status;
  size_t offset;
  void *userData_local;
  curi_settings *settings_local;
  size_t len_local;
  char *query_local;
  
  sStack_30 = 0;
  offset = (size_t)userData;
  userData_local = settings;
  settings_local = (curi_settings *)len;
  len_local = (size_t)query;
  if (settings == (curi_settings *)0x0) {
    curi_default_settings((curi_settings *)local_c0);
    defaultSettings._132_4_ =
         parse_query((char *)len_local,(size_t)settings_local,&stack0xffffffffffffffd0,
                     (curi_settings *)local_c0,(void *)offset,0);
  }
  else {
    defaultSettings._132_4_ = parse_query(query,len,&stack0xffffffffffffffd0,settings,userData,0);
  }
  if (defaultSettings._132_4_ == 0) {
    pcVar1 = read_char((char *)len_local,(size_t)settings_local,&stack0xffffffffffffffd0);
    if (*pcVar1 != '\0') {
      defaultSettings._132_4_ = 2;
    }
  }
  return defaultSettings._132_4_;
}

Assistant:

curi_status curi_parse_query(const char* query, size_t len, const curi_settings* settings /*= 0*/, void* userData /*= 0*/)
{
    size_t offset = 0;
    curi_status status;

    if (settings)
    {
        // parsing with the given settings
        status = parse_query(query, len, &offset, settings, userData, 0);
    }
    else
    {
        curi_settings defaultSettings;
        curi_default_settings(&defaultSettings);
        // parsing with default settings
        status = parse_query(query, len, &offset, &defaultSettings, userData, 0);
    }

    if (status == curi_status_success && *read_char(query, len, &offset) != '\0')
        // the imput weren't fully consumed
        // TODO: set an error string somewhere
        status = curi_status_error;

    return status;
}